

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.hpp
# Opt level: O2

void __thiscall OpenMD::Mie::~Mie(Mie *this)

{
  ~Mie(this);
  operator_delete(this,200);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }